

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall Assimp::FBX::Node::AddChild<double>(Node *this,string *name,double more)

{
  Node c;
  Node local_80;
  
  Node(&local_80,name);
  AddProperties<double>(&local_80,more);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_80);
  ~Node(&local_80);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }